

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase56::run(TestCase56 *this)

{
  long lVar1;
  PromiseArena *pPVar2;
  AsyncIoStream *pAVar3;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  SourceLocation location_04;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar4;
  int iVar5;
  undefined4 extraout_var;
  void *pvVar6;
  SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:79:54)>
  *location_05;
  SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:83:11)>
  *location_06;
  SimpleTransformPromiseNode<unsigned_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:68:21)>
  *location_07;
  SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:72:11)>
  *location_08;
  TransformPromiseNodeBase *pTVar7;
  OwnPromiseNode intermediate_3;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_180;
  OwnPromiseNode intermediate_4;
  anon_class_8_1_5036e509_for_func local_170;
  OwnPromiseNode intermediate;
  PromiseFulfillerPair<unsigned_int> *in_stack_fffffffffffffea0;
  OwnPromiseNode in_stack_fffffffffffffea8;
  OwnPromiseNode OVar8;
  OwnPromiseNode OVar9;
  anon_class_8_1_f13b8d0e_for_func in_stack_fffffffffffffeb0;
  void *continuationTracePtr_4;
  String *pSStack_140;
  char *local_138;
  bool local_128;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_120;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_118;
  void *continuationTracePtr_2;
  PromiseNode *local_108;
  String result;
  char receiveBuffer [4];
  PromiseFulfillerPair<unsigned_int> port;
  Own<kj::AsyncIoStream,_std::nullptr_t> client;
  Own<kj::AsyncIoStream,_std::nullptr_t> server;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  AsyncIoContext ioContext;
  
  setupAsyncIo();
  iVar5 = (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[3])();
  listener.disposer = (Disposer *)0x0;
  listener.ptr = (ConnectionReceiver *)0x0;
  receiveBuffer[0] = '\0';
  receiveBuffer[1] = '\0';
  receiveBuffer[2] = '\0';
  receiveBuffer[3] = '\0';
  server.disposer = (Disposer *)0x0;
  server.ptr = (AsyncIoStream *)0x0;
  client.disposer = (Disposer *)0x0;
  client.ptr = (AsyncIoStream *)0x0;
  location_04.function = (char *)in_stack_fffffffffffffea8.ptr;
  location_04.fileName = (char *)in_stack_fffffffffffffea0;
  location_04._16_8_ = in_stack_fffffffffffffeb0.network;
  newPromiseAndFulfiller<unsigned_int>(location_04);
  result.content.ptr =
       (char *)kj::_::
               SimpleTransformPromiseNode<unsigned_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:68:21)>
               ::anon_class_8_1_f13b8d0e_for_func::operator();
  lVar1 = *(long *)((long)port.promise.super_PromiseBase.node.ptr + 8);
  if (lVar1 == 0 || (ulong)((long)port.promise.super_PromiseBase.node.ptr - lVar1) < 0x28) {
    pvVar6 = operator_new(0x400);
    location_07 = (SimpleTransformPromiseNode<unsigned_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:68:21)>
                   *)((long)pvVar6 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_int,kj::(anonymous_namespace)::TestCase56::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase56::run()::__0,void*&>
              (location_07,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&port,
               (anon_class_8_1_f13b8d0e_for_func *)&stack0xfffffffffffffeb0,(void **)&result);
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    *(undefined8 *)((long)port.promise.super_PromiseBase.node.ptr + 8) = 0;
    location_07 = (SimpleTransformPromiseNode<unsigned_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:68:21)>
                   *)((long)port.promise.super_PromiseBase.node.ptr + -0x28);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_int,kj::(anonymous_namespace)::TestCase56::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase56::run()::__0,void*&>
              (location_07,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&port,
               (anon_class_8_1_f13b8d0e_for_func *)&stack0xfffffffffffffeb0,(void **)&result);
    *(long *)((long)port.promise.super_PromiseBase.node.ptr + -0x20) = lVar1;
  }
  continuationTracePtr_4 = &DAT_003d3151;
  pSStack_140 = (String *)&DAT_003d31b0;
  local_138 = (char *)0x4c0000058b;
  location.function = &DAT_003d31b0;
  location.fileName = &DAT_003d3151;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  intermediate.ptr = (PromiseNode *)location_07;
  kj::_::maybeChain<kj::Own<kj::NetworkAddress,decltype(nullptr)>>
            (&intermediate_3,(Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&intermediate,
             location);
  OVar8 = intermediate_3;
  intermediate_3.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  continuationTracePtr_2 = (void *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr_2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  pPVar2 = ((OVar8.ptr)->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)OVar8.ptr - (long)pPVar2) < 0x28) {
    pvVar6 = operator_new(0x400);
    pTVar7 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,(OwnPromiseNode *)&stack0xfffffffffffffea8,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:70:11)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_005839d0;
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
    OVar9.ptr = OVar8.ptr;
  }
  else {
    ((OVar8.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar7 = (TransformPromiseNodeBase *)&OVar8.ptr[-3].super_PromiseArenaMember.arena;
    OVar9.ptr = OVar8.ptr;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,(OwnPromiseNode *)&stack0xfffffffffffffea8,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:70:11)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar8.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_005839d0;
    OVar8.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  continuationTracePtr_4 = &DAT_003d3151;
  pSStack_140 = (String *)&DAT_003d31b0;
  local_138 = (char *)0x4c0000058b;
  location_00.function = &DAT_003d31b0;
  location_00.fileName = &DAT_003d3151;
  location_00.lineNumber = 0x58b;
  location_00.columnNumber = 0x4c;
  result.content.ptr = (char *)pTVar7;
  kj::_::maybeChain<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
            ((OwnPromiseNode *)&continuationTracePtr_2,
             (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&result,location_00);
  pvVar6 = continuationTracePtr_2;
  continuationTracePtr_2 = (void *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr_2);
  local_180.ptr = (PromiseNode *)pvVar6;
  intermediate.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&result);
  OVar4.ptr = local_180.ptr;
  local_170.client = &client;
  result.content.ptr =
       (char *)kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:72:11)>
               ::anon_class_8_1_5036e509_for_func::operator();
  pPVar2 = ((local_180.ptr)->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_180.ptr - (long)pPVar2) < 0x28) {
    pvVar6 = operator_new(0x400);
    location_08 = (SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:72:11)>
                   *)((long)pvVar6 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase56::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase56::run()::__2,void*&>
              (location_08,&local_180,&local_170,(void **)&result);
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    ((local_180.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_08 = (SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:72:11)>
                   *)&local_180.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase56::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase56::run()::__2,void*&>
              (location_08,&local_180,&local_170,(void **)&result);
    OVar4.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  continuationTracePtr_4 = &DAT_003d3151;
  pSStack_140 = (String *)&DAT_003d31b0;
  local_138 = (char *)0x4c0000058b;
  location_01.function = &DAT_003d31b0;
  location_01.fileName = &DAT_003d3151;
  location_01.lineNumber = 0x58b;
  location_01.columnNumber = 0x4c;
  intermediate.ptr = (PromiseNode *)location_08;
  kj::_::maybeChain<void>(&intermediate_3,(Promise<void> *)&intermediate,location_01);
  OVar8 = intermediate_3;
  intermediate_3.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  intermediate_4 = OVar8;
  continuationTracePtr_2 = (void *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr_2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  OVar8 = intermediate_4;
  pPVar2 = ((intermediate_4.ptr)->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)intermediate_4.ptr - (long)pPVar2) < 0x28) {
    pvVar6 = operator_new(0x400);
    pTVar7 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&intermediate_4,
               kj::_::
               TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h:1653:25),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:75:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_00583a80;
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    ((intermediate_4.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pTVar7 = (TransformPromiseNodeBase *)&intermediate_4.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar7,&intermediate_4,
               kj::_::
               TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h:1653:25),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:75:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar8.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00583a80;
    OVar8.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  continuationTracePtr_4 = (void *)0x0;
  result.content.ptr = (char *)0x0;
  intermediate.ptr = &pTVar7->super_PromiseNode;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&result);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr_4);
  kj::_::detach((Promise<void> *)&intermediate);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_4);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffea8);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar5))
            (&local_120,(undefined8 *)CONCAT44(extraout_var,iVar5),"*",2,0);
  intermediate.ptr = (PromiseNode *)&listener;
  continuationTracePtr_2 =
       kj::_::
       SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:79:54)>
       ::anon_class_16_2_642b6666_for_func::operator();
  pPVar2 = ((local_120.ptr)->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_120.ptr - (long)pPVar2) < 0x30) {
    pvVar6 = operator_new(0x400);
    location_05 = (SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:79:54)>
                   *)((long)pvVar6 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase56::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase56::run()::__4,void*&>
              (location_05,&local_120,(anon_class_16_2_642b6666_for_func *)&intermediate,
               &continuationTracePtr_2);
    *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
  }
  else {
    ((local_120.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_05 = (SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:79:54)>
                   *)(local_120.ptr + -3);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase56::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase56::run()::__4,void*&>
              (location_05,&local_120,(anon_class_16_2_642b6666_for_func *)&intermediate,
               &continuationTracePtr_2);
    local_120.ptr[-3].super_PromiseArenaMember.arena = pPVar2;
  }
  continuationTracePtr_4 = &DAT_003d3151;
  pSStack_140 = (String *)&DAT_003d31b0;
  local_138 = (char *)0x4c0000058b;
  location_02.function = &DAT_003d31b0;
  location_02.fileName = &DAT_003d3151;
  location_02.lineNumber = 0x58b;
  location_02.columnNumber = 0x4c;
  intermediate_3.ptr = (PromiseNode *)location_05;
  kj::_::maybeChain<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
            (&local_180,(Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&intermediate_3,
             location_02);
  OVar4.ptr = local_180.ptr;
  local_180.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
  local_118.ptr = OVar4.ptr;
  intermediate_4.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_4);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  OVar4.ptr = local_118.ptr;
  continuationTracePtr_2 = &server;
  intermediate_3.ptr =
       (PromiseNode *)
       kj::_::
       SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:83:11)>
       ::anon_class_16_2_f6449cab_for_func::operator();
  pPVar2 = ((local_118.ptr)->super_PromiseArenaMember).arena;
  local_108 = (PromiseNode *)receiveBuffer;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_118.ptr - (long)pPVar2) < 0x30) {
    pvVar6 = operator_new(0x400);
    location_06 = (SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:83:11)>
                   *)((long)pvVar6 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase56::run()::__5>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase56::run()::__5,void*&>
              (location_06,&local_118,(anon_class_16_2_f6449cab_for_func *)&continuationTracePtr_2,
               &intermediate_3.ptr);
    *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
  }
  else {
    ((local_118.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_06 = (SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:83:11)>
                   *)(local_118.ptr + -3);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::AsyncIoStream,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase56::run()::__5>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase56::run()::__5,void*&>
              (location_06,&local_118,(anon_class_16_2_f6449cab_for_func *)&continuationTracePtr_2,
               &intermediate_3.ptr);
    OVar4.ptr[-3].super_PromiseArenaMember.arena = pPVar2;
  }
  continuationTracePtr_4 = &DAT_003d3151;
  pSStack_140 = (String *)&DAT_003d31b0;
  local_138 = (char *)0x4c0000058b;
  location_03.function = &DAT_003d31b0;
  location_03.fileName = &DAT_003d3151;
  location_03.lineNumber = 0x58b;
  location_03.columnNumber = 0x4c;
  intermediate_4.ptr = (PromiseNode *)location_06;
  kj::_::maybeChain<unsigned_long>
            ((OwnPromiseNode *)&stack0xfffffffffffffea8,(Promise<unsigned_long> *)&intermediate_4,
             location_03);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffea8);
  local_180.ptr = (PromiseNode *)0x0;
  local_170.client = (Own<kj::AsyncIoStream,_std::nullptr_t> *)OVar9.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_4);
  continuationTracePtr_4 =
       kj::_::
       SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:86:11)>
       ::anon_class_8_1_2dcb5b23_for_func::operator();
  pAVar3 = (local_170.client)->ptr;
  local_180.ptr = (PromiseNode *)receiveBuffer;
  if (pAVar3 == (AsyncIoStream *)0x0 || (ulong)((long)local_170.client - (long)pAVar3) < 0x28) {
    pvVar6 = operator_new(0x400);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase56::run()::__6>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase56::run()::__6,void*&>
              ((SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:86:11)>
                *)((long)pvVar6 + 0x3d8),
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170,
               (anon_class_8_1_2dcb5b23_for_func *)&local_180,&continuationTracePtr_4);
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    (local_170.client)->ptr = (AsyncIoStream *)0x0;
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase56::run()::__6>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase56::run()::__6,void*&>
              ((SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:86:11)>
                *)&local_170.client[-3].ptr,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170,
               (anon_class_8_1_2dcb5b23_for_func *)&local_180,&continuationTracePtr_4);
    ((PromiseArenaMember *)&local_170.client[-2].disposer)->_vptr_PromiseArenaMember =
         (_func_int **)pAVar3;
  }
  intermediate_3.ptr = (PromiseNode *)0x0;
  intermediate_4.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_4);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  Promise<kj::String>::wait((Promise<kj::String> *)&result,&stack0xfffffffffffffeb0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffeb0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_170);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_118);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_120);
  intermediate.ptr = (PromiseNode *)0x423c58;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_4,
             (DebugExpression<char_const(&)[4]> *)&intermediate,&result);
  if ((local_128 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x5b,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (result)\", _kjCondition, \"foo\", result",
               (char (*) [37])"failed: expected (\"foo\") == (result)",
               (DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_4,
               (char (*) [4])0x423c58,&result);
  }
  Array<char>::~Array(&result.content);
  PromiseFulfillerPair<unsigned_int>::~PromiseFulfillerPair(&port);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&client);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&server);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::dispose(&listener);
  AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(AsyncIo, SimpleNetwork) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  Own<ConnectionReceiver> listener;
  Own<AsyncIoStream> server;
  Own<AsyncIoStream> client;

  char receiveBuffer[4]{};

  auto port = newPromiseAndFulfiller<uint>();

  port.promise.then([&](uint portnum) {
    return network.parseAddress("localhost", portnum);
  }).then([&](Own<NetworkAddress>&& result) {
    return result->connect();
  }).then([&](Own<AsyncIoStream>&& result) {
    client = kj::mv(result);
    return client->write("foo"_kjb);
  }).detach([](kj::Exception&& exception) {
    KJ_FAIL_EXPECT(exception);
  });

  kj::String result = network.parseAddress("*").then([&](Own<NetworkAddress>&& result) {
    listener = result->listen();
    port.fulfiller->fulfill(listener->getPort());
    return listener->accept();
  }).then([&](Own<AsyncIoStream>&& result) {
    server = kj::mv(result);
    return server->tryRead(receiveBuffer, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer, n);
  }).wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
}